

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

uint32_t __thiscall kratos::Expr::width(Expr *this)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  VarException *this_00;
  allocator<const_kratos::IRNode_*> local_91;
  Var *local_90;
  Var *local_88;
  Var **local_80;
  size_type local_78;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_70;
  allocator<char> local_41;
  string local_40;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t right_width;
  uint32_t left_width;
  Expr *this_local;
  
  _right_width = this;
  bVar1 = is_relational_op(this->op);
  if ((bVar1) || (bVar1 = is_reduction_op(this->op), bVar1)) {
    this_local._4_4_ = 1;
  }
  else {
    local_1c = (*(this->left->super_IRNode)._vptr_IRNode[7])();
    this_local._4_4_ = local_1c;
    if (this->right != (Var *)0x0) {
      local_20 = (*(this->right->super_IRNode)._vptr_IRNode[7])();
      if (local_1c != local_20) {
        this_00 = (VarException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Unable to resolve expression width",&local_41);
        local_90 = this->left;
        local_88 = this->right;
        local_80 = &local_90;
        local_78 = 2;
        std::allocator<const_kratos::IRNode_*>::allocator(&local_91);
        __l._M_len = local_78;
        __l._M_array = (iterator)local_80;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_70,__l,&local_91);
        VarException::VarException(this_00,&local_40,&local_70);
        __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
      }
      this_local._4_4_ = local_1c;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Expr::width() const {
    if (is_relational_op(op) || is_reduction_op(op)) return 1;
    auto left_width = left->width();
    if (right) {
        auto right_width = right->width();
        // LCOV_EXCL_START
        if (left_width != right_width)
            throw VarException("Unable to resolve expression width", {left, right});
        // LCOV_EXCL_STOP
        return left_width;
    }
    return left_width;
}